

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O2

void __thiscall Meter::setValue(Meter *this,qreal v)

{
  MeterPrivate *pMVar1;
  bool bVar2;
  ulong uVar3;
  double dVar4;
  
  pMVar1 = (this->d).d;
  if (((pMVar1->minValue < v) ||
      (dVar4 = v - pMVar1->minValue, uVar3 = -(ulong)(dVar4 < -dVar4),
      (double)(~uVar3 & (ulong)dVar4 | (ulong)-dVar4 & uVar3) < 1e-06)) &&
     ((v < pMVar1->maxValue ||
      (dVar4 = v - pMVar1->maxValue, uVar3 = -(ulong)(dVar4 < -dVar4),
      (double)(~uVar3 & (ulong)dVar4 | (ulong)-dVar4 & uVar3) < 1e-06)))) {
    pMVar1->value = v;
    QWidget::update();
    valueChanged(this,v);
    bVar2 = MeterPrivate::thresholdFired((this->d).d);
    if (bVar2) {
      thresholdFired(this,((this->d).d)->currentThreshold);
      return;
    }
  }
  return;
}

Assistant:

void
Meter::setValue( qreal v )
{
	if( ( v > d->minValue || qAbs( v - d->minValue ) < 0.000001 ) &&
		( v < d->maxValue || qAbs( v - d->maxValue ) < 0.000001 ) )
	{
		d->value = v;

		update();

		emit valueChanged( v );

		if( d->thresholdFired() )
			emit thresholdFired( d->currentThreshold );
	}
}